

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O0

void __thiscall bandit::reporter::spec::it_unknown_error(spec *this,string *desc)

{
  ostream *poVar1;
  string local_68 [48];
  string local_38 [32];
  string *local_18;
  string *desc_local;
  spec *this_local;
  
  local_18 = desc;
  desc_local = (string *)this;
  progress_base::it_unknown_error((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
  std::operator<<(poVar1,local_38);
  std::__cxx11::string::~string(local_38);
  std::operator<<((this->super_colored_base).stm_,"ERROR");
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])();
  std::operator<<(poVar1,local_68);
  std::__cxx11::string::~string(local_68);
  std::ostream::operator<<((this->super_colored_base).stm_,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        progress_base::it_unknown_error(desc);
        stm_ << colorizer_.bad();
        stm_ << "ERROR";
        stm_ << colorizer_.reset();
        stm_ << std::endl;
        stm_.flush();
      }